

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

Integer pnga_pgroup_split(Integer grp,Integer grp_num)

{
  Integer *list;
  long grp_00;
  long lVar1;
  long lVar2;
  Integer IVar3;
  long lVar4;
  long lVar5;
  long count;
  Integer IVar6;
  long lVar7;
  
  list = (Integer *)malloc(GAnproc << 3);
  if (grp_num < 0) {
    pnga_error("Invalid argument (number of groups < 0)",grp_num);
  }
  if (grp_num != 0) {
    grp_00 = (long)GA_Default_Proc_Group;
    pnga_pgroup_set_default(grp);
    lVar1 = (long)GA_Default_Proc_Group;
    lVar7 = GAnproc;
    if (0 < lVar1) {
      lVar7 = (long)PGRP_LIST[lVar1].map_nproc;
    }
    lVar4 = GAme;
    if (0 < GA_Default_Proc_Group) {
      lVar4 = (long)PGRP_LIST[lVar1].map_proc_list[GAme];
    }
    count = (ulong)(grp_num * (lVar7 / grp_num) < lVar7) + lVar7 / grp_num;
    lVar2 = (lVar4 / count + 1) * count;
    lVar1 = lVar2 + -1;
    lVar5 = lVar7 + -1;
    if (lVar1 < lVar7 + -1) {
      lVar5 = lVar1;
    }
    if (lVar5 < count * (lVar4 / count)) {
      pnga_error("Invalid proc range encountered",0);
    }
    if (lVar7 < 1) {
      IVar6 = -1;
      IVar3 = 0;
    }
    else {
      IVar6 = -1;
      IVar3 = 0;
      lVar1 = 0;
      do {
        if ((lVar1 != 0) && (IVar3 % count == 0)) {
          IVar3 = pnga_pgroup_create(list,count);
          if (lVar5 + 1 == lVar1) {
            IVar6 = IVar3;
          }
          IVar3 = 0;
        }
        list[IVar3] = lVar1;
        IVar3 = IVar3 + 1;
        lVar1 = lVar1 + 1;
      } while (lVar7 != lVar1);
    }
    grp = pnga_pgroup_create(list,IVar3);
    if (lVar2 < lVar7) {
      grp = IVar6;
    }
    pnga_pgroup_set_default(grp_00);
    if (grp == -1) {
      pnga_error("ga_pgroup_split failed",-1);
    }
    free(list);
  }
  return grp;
}

Assistant:

Integer pnga_pgroup_split(Integer grp, Integer grp_num)
{
  Integer nprocs, me, default_grp;
  Integer ratio, start, end, grp_size;
  Integer i, icnt;
  Integer *nodes;
  Integer grp_id, ret=-1;

  /* Allocate temporary array */
  nodes = (Integer*)malloc(GAnproc*sizeof(Integer));

  if(grp_num<0) pnga_error("Invalid argument (number of groups < 0)",grp_num);
  if(grp_num==0) return grp;
  
  default_grp = pnga_pgroup_get_default();
  pnga_pgroup_set_default(grp);
  
#if 0 /* This is wrong. Should split only default group and not world group */
  world_grp = pnga_pgroup_get_world();
  pnga_pgroup_set_default(world_grp);
#endif
  nprocs = pnga_nnodes();
  me = pnga_nodeid();
  /* Figure out how big groups are */
  grp_size = nprocs/grp_num;
  if (nprocs > grp_size*grp_num) grp_size++;
  /* Figure out what procs are in my group */
  ratio = me/grp_size;
  start = ratio*grp_size;
  end = (ratio+1)*grp_size-1;
  end = GA_MIN(end,nprocs-1);
  if (end<start)
    pnga_error("Invalid proc range encountered",0);
  icnt = 0;
  for (i= 0; i<nprocs; i++) {
    if (icnt%grp_size == 0 && i>0) {
      grp_id = pnga_pgroup_create(nodes, grp_size);
      if (i == end + 1) {
        ret = grp_id;
      }
      icnt = 0;
    }
    nodes[icnt] = i;
    icnt++;
  }
  grp_id = pnga_pgroup_create(nodes, icnt);
  if (end == nprocs-1) {
    ret = grp_id;
  }
  pnga_pgroup_set_default(default_grp);
  if(ret==-1) pnga_error("ga_pgroup_split failed",ret);
  /* Free temporary array */
  free(nodes);
  return ret;
}